

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

int __thiscall
CVmObjByteArray::getp_unpackBytes
          (CVmObjByteArray *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  ushort *puVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  CVmByteArraySource src;
  CVmDataSource local_60;
  vm_obj_id_t local_58;
  CVmObjPageEntry *local_50;
  ulong local_48;
  undefined8 uStack_40;
  ulong local_38;
  undefined8 local_30;
  
  if (oargc == (uint *)0x0) {
    lVar6 = -1;
  }
  else {
    lVar6 = (long)(int)(*oargc - 1);
  }
  if (getp_unpackBytes(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_unpackBytes();
  }
  iVar2 = CVmObject::get_prop_check_argc(retval,oargc,&getp_unpackBytes::desc);
  if (iVar2 == 0) {
    uVar3 = CVmBif::pop_long_val();
    if ((int)uVar3 < 1) {
      uVar7 = 0;
    }
    else {
      uVar1 = *(uint *)(this->super_CVmObject).ext_;
      if (uVar1 < uVar3) {
        uVar3 = uVar1;
      }
      uVar7 = (ulong)uVar3 - 1;
    }
    puVar4 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
    local_60._vptr_CVmDataSource = (_func_int **)&PTR__CVmDataSource_003686c8;
    local_30 = 0;
    local_50 = G_obj_table_X.pages_[self >> 0xc] + (self & 0xfff);
    uStack_40 = 0;
    local_38 = (ulong)**(uint **)((long)&local_50->ptr_ + 8);
    uVar5 = 0;
    if (((long)uVar7 < 0) || (uVar5 = local_38, local_48 = uVar7, (long)local_38 < (long)uVar7)) {
      local_48 = uVar5;
    }
    local_58 = self;
    CVmPack::unpack(retval,(char *)(puVar4 + 1),(ulong)*puVar4,&local_60);
    sp_ = sp_ + -lVar6;
  }
  return 1;
}

Assistant:

int CVmObjByteArray::getp_unpackBytes(
    VMG_ vm_obj_id_t self, vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = oargc != 0 ? *oargc : 0;
    static CVmNativeCodeDesc desc(2);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* retrieve the starting index from the first argument */
    long idx = CVmBif::pop_long_val(vmg0_);
    --argc;

    /* limit the index to 1..length */
    if (idx < 1)
        idx = 1;
    else if ((ulong)idx > get_element_count())
        idx = get_element_count();

    /* get the format string, but leave it on the stack for gc protection */
    const char *fmt = G_stk->get(0)->get_as_string(vmg0_);

    /* get the format string length and buffer pointer */
    size_t fmtlen = vmb_get_len(fmt);
    fmt += VMB_LEN;

    /* set up a data source for the byte array */
    CVmByteArraySource src(vmg_ self);

    /* seek to the starting index */
    src.seek(idx - 1, OSFSK_SET);

    /* do the unpacking */
    CVmPack::unpack(vmg_ retval, fmt, fmtlen, &src);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}